

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

void ZopfliInitBlockState
               (ZopfliOptions *options,size_t blockstart,size_t blockend,int add_lmc,
               ZopfliBlockState *s)

{
  unsigned_short *puVar1;
  int in_ECX;
  unsigned_short *in_RDX;
  uchar *in_RSI;
  unsigned_short *in_RDI;
  ZopfliLongestMatchCache *in_R8;
  undefined4 in_stack_ffffffffffffffe0;
  
  in_R8->length = in_RDI;
  in_R8->sublen = in_RSI;
  in_R8[1].length = in_RDX;
  if (in_ECX == 0) {
    in_R8->dist = (unsigned_short *)0x0;
  }
  else {
    puVar1 = (unsigned_short *)malloc(0x18);
    in_R8->dist = puVar1;
    ZopfliInitCache(CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8);
  }
  return;
}

Assistant:

void ZopfliInitBlockState(const ZopfliOptions* options,
                          size_t blockstart, size_t blockend, int add_lmc,
                          ZopfliBlockState* s) {
  s->options = options;
  s->blockstart = blockstart;
  s->blockend = blockend;
#ifdef ZOPFLI_LONGEST_MATCH_CACHE
  if (add_lmc) {
    s->lmc = (ZopfliLongestMatchCache*)malloc(sizeof(ZopfliLongestMatchCache));
    ZopfliInitCache(blockend - blockstart, s->lmc);
  } else {
    s->lmc = 0;
  }
#endif
}